

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int nlohmann::detail::dtoa_impl::find_largest_pow10(uint32_t n,uint32_t *pow10)

{
  uint32_t *pow10_local;
  uint32_t n_local;
  undefined4 local_4;
  
  if (n < 1000000000) {
    if (n < 100000000) {
      if (n < 10000000) {
        if (n < 1000000) {
          if (n < 100000) {
            if (n < 10000) {
              if (n < 1000) {
                if (n < 100) {
                  if (n < 10) {
                    *pow10 = 1;
                    local_4 = 1;
                  }
                  else {
                    *pow10 = 10;
                    local_4 = 2;
                  }
                }
                else {
                  *pow10 = 100;
                  local_4 = 3;
                }
              }
              else {
                *pow10 = 1000;
                local_4 = 4;
              }
            }
            else {
              *pow10 = 10000;
              local_4 = 5;
            }
          }
          else {
            *pow10 = 100000;
            local_4 = 6;
          }
        }
        else {
          *pow10 = 1000000;
          local_4 = 7;
        }
      }
      else {
        *pow10 = 10000000;
        local_4 = 8;
      }
    }
    else {
      *pow10 = 100000000;
      local_4 = 9;
    }
  }
  else {
    *pow10 = 1000000000;
    local_4 = 10;
  }
  return local_4;
}

Assistant:

inline int find_largest_pow10(const std::uint32_t n, std::uint32_t& pow10)
{
    // LCOV_EXCL_START
    if (n >= 1000000000)
    {
        pow10 = 1000000000;
        return 10;
    }
    // LCOV_EXCL_STOP
    else if (n >= 100000000)
    {
        pow10 = 100000000;
        return  9;
    }
    else if (n >= 10000000)
    {
        pow10 = 10000000;
        return  8;
    }
    else if (n >= 1000000)
    {
        pow10 = 1000000;
        return  7;
    }
    else if (n >= 100000)
    {
        pow10 = 100000;
        return  6;
    }
    else if (n >= 10000)
    {
        pow10 = 10000;
        return  5;
    }
    else if (n >= 1000)
    {
        pow10 = 1000;
        return  4;
    }
    else if (n >= 100)
    {
        pow10 = 100;
        return  3;
    }
    else if (n >= 10)
    {
        pow10 = 10;
        return  2;
    }
    else
    {
        pow10 = 1;
        return 1;
    }
}